

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

Type * LLVMBC::resolve_gep_element_type(Type *type,Vector<Value_*> *args)

{
  pointer ppVVar1;
  Value *value;
  TypeID TVar2;
  uint uVar3;
  Constant *this;
  APInt *this_00;
  uint64_t uVar4;
  StructType *pSVar5;
  VectorType *this_01;
  LoggingCallback p_Var6;
  void *pvVar7;
  char *__ptr;
  ulong uVar8;
  size_t sStack_1030;
  char buffer [4096];
  
  uVar8 = 2;
  do {
    ppVVar1 = (args->
              super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3) <= uVar8) {
      return type;
    }
    value = ppVVar1[uVar8];
    TVar2 = Type::getTypeID(type);
    if (TVar2 == StructTyID) {
      this = &dyn_cast<LLVMBC::ConstantInt>(value)->super_Constant;
      if (this == (Constant *)0x0) {
        p_Var6 = dxil_spv::get_thread_log_callback();
        if (p_Var6 == (LoggingCallback)0x0) {
          __ptr = "[ERROR]: Indexing into a struct without a constant integer.\n";
          sStack_1030 = 0x3c;
LAB_0017329a:
          fwrite(__ptr,sStack_1030,1,_stderr);
          fflush(_stderr);
          return (Type *)0x0;
        }
        builtin_strncpy(buffer,"Indexing into a struct without a constant integer.\n",0x34);
LAB_0017324e:
        pvVar7 = dxil_spv::get_thread_log_callback_userdata();
        (*p_Var6)(pvVar7,Error,buffer);
        return (Type *)0x0;
      }
      this_00 = Constant::getUniqueInteger(this);
      uVar4 = APInt::getZExtValue(this_00);
      pSVar5 = cast<LLVMBC::StructType>(type);
      uVar3 = StructType::getNumElements(pSVar5);
      if (uVar3 <= (uint)uVar4) {
        p_Var6 = dxil_spv::get_thread_log_callback();
        if (p_Var6 == (LoggingCallback)0x0) {
          __ptr = "[ERROR]: Struct element index out of range.\n";
          sStack_1030 = 0x2c;
          goto LAB_0017329a;
        }
        builtin_strncpy(buffer + 0x10,"ndex out of rang",0x10);
        builtin_strncpy(buffer,"Struct element i",0x10);
        builtin_strncpy(buffer + 0x20,"e.\n",4);
        goto LAB_0017324e;
      }
      pSVar5 = cast<LLVMBC::StructType>(type);
      type = StructType::getElementType(pSVar5,(uint)uVar4);
    }
    else {
      TVar2 = Type::getTypeID(type);
      if (TVar2 == ArrayTyID) {
        type = Type::getArrayElementType(type);
      }
      else {
        TVar2 = Type::getTypeID(type);
        if (TVar2 != VectorTyID) {
          return (Type *)0x0;
        }
        this_01 = cast<LLVMBC::VectorType>(type);
        type = VectorType::getElementType(this_01);
      }
    }
    uVar8 = (ulong)((int)uVar8 + 1);
  } while( true );
}

Assistant:

static Type *resolve_gep_element_type(Type *type, const Vector<Value *> &args)
{
	for (unsigned i = 2; i < args.size(); i++)
	{
		auto *arg = args[i];
		if (type->getTypeID() == Type::TypeID::StructTyID)
		{
			auto *const_int = dyn_cast<ConstantInt>(arg);
			if (!const_int)
			{
				LOGE("Indexing into a struct without a constant integer.\n");
				return nullptr;
			}

			unsigned index = const_int->getUniqueInteger().getZExtValue();
			if (index >= cast<StructType>(type)->getNumElements())
			{
				LOGE("Struct element index out of range.\n");
				return nullptr;
			}
			type = cast<StructType>(type)->getElementType(index);
		}
		else if (type->getTypeID() == Type::TypeID::ArrayTyID)
		{
			type = type->getArrayElementType();
		}
		else if (type->getTypeID() == Type::TypeID::VectorTyID)
		{
			type = cast<VectorType>(type)->getElementType();
		}
		else
			return nullptr;
	}

	return type;
}